

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpg4d_parser.c
# Opt level: O0

MPP_RET mpp_mpg4_parser_update_dpb(Mpg4dParser ctx)

{
  uint uVar1;
  RK_S32 index_00;
  int index_01;
  MppBufSlots slots_00;
  RK_S32 index;
  RK_S32 coding_type;
  Mpg4Hdr *hdr_ref1;
  Mpg4Hdr *hdr_ref0;
  Mpg4Hdr *hdr_curr;
  MppBufSlots slots;
  Mpg4dParserImpl *p;
  Mpg4dParser ctx_local;
  
  slots_00 = *ctx;
  uVar1 = *(uint *)((long)ctx + 0x198);
  if ((mpg4d_debug & 1) != 0) {
    _mpp_log_l(4,"mpg4d_parser","in\n","mpp_mpg4_parser_update_dpb");
  }
  if (*(long *)((long)ctx + 0x360) != *(long *)((long)ctx + 0x350)) {
    *(long *)((long)ctx + 0x358) = *(long *)((long)ctx + 0x360) - *(long *)((long)ctx + 0x350);
  }
  if (uVar1 == 0xffffffff) goto LAB_001f48e7;
  if (1 < uVar1) {
    if (uVar1 == 2) {
      if (((*(int *)((long)ctx + 0x278) < 0) || (*(int *)((long)ctx + 0x328) < 0)) &&
         (_mpp_log_l(2,"mpg4d_parser","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "(hdr_ref0->slot_idx >= 0) && (hdr_ref1->slot_idx >= 0)",
                     "mpp_mpg4_parser_update_dpb",0x5ea), (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      index_00 = *(RK_S32 *)((long)ctx + 0x1c8);
      mpp_buf_slot_set_flag(slots_00,index_00,SLOT_QUEUE_USE);
      mpp_buf_slot_enqueue(slots_00,index_00,QUEUE_DISPLAY);
      goto LAB_001f48e7;
    }
    if (uVar1 != 3) goto LAB_001f48e7;
  }
  index_01 = *(int *)((long)ctx + 0x278);
  if ((*(int *)((long)ctx + 0x27c) == 0) && (-1 < index_01)) {
    mpp_buf_slot_set_flag(slots_00,index_01,SLOT_QUEUE_USE);
    mpp_buf_slot_enqueue(slots_00,index_01,QUEUE_DISPLAY);
  }
  mpp_buf_slot_set_flag(slots_00,*(RK_S32 *)((long)ctx + 0x1c8),SLOT_CODEC_USE);
  if (-1 < *(int *)((long)ctx + 0x328)) {
    mpp_buf_slot_clr_flag(slots_00,*(int *)((long)ctx + 0x328),SLOT_CODEC_USE);
  }
  memcpy((void *)((long)ctx + 0x298),(void *)((long)ctx + 0x1e8),0xb0);
  memcpy((void *)((long)ctx + 0x1e8),(Mpg4Hdr *)((long)ctx + 0x138),0xb0);
  *(undefined8 *)((long)ctx + 0x1c0) = 0;
LAB_001f48e7:
  init_mpg4_hdr_vop((Mpg4Hdr *)((long)ctx + 0x138));
  *(undefined4 *)((long)ctx + 0x1c8) = 0xffffffff;
  *(undefined8 *)((long)ctx + 0x350) = *(undefined8 *)((long)ctx + 0x360);
  if ((mpg4d_debug & 1) != 0) {
    _mpp_log_l(4,"mpg4d_parser","out\n","mpp_mpg4_parser_update_dpb");
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_mpg4_parser_update_dpb(Mpg4dParser ctx)
{
    Mpg4dParserImpl *p = (Mpg4dParserImpl *)ctx;
    MppBufSlots slots = p->frame_slots;
    Mpg4Hdr *hdr_curr = &p->hdr_curr;
    Mpg4Hdr *hdr_ref0 = &p->hdr_ref0;
    Mpg4Hdr *hdr_ref1 = &p->hdr_ref1;
    RK_S32 coding_type = hdr_curr->vop.coding_type;
    RK_S32 index = p->output;

    mpg4d_dbg_func("in\n");

    // update pts increacement
    if (p->pts != p->last_pts)
        p->pts_inc = p->pts - p->last_pts;

    switch (coding_type) {
    case MPEG4_B_VOP : {
        mpp_assert((hdr_ref0->slot_idx >= 0) && (hdr_ref1->slot_idx >= 0));
        // B frame -> index current frame
        // output current frame and do not change ref0 and ref1
        index = hdr_curr->slot_idx;
        mpp_buf_slot_set_flag(slots, index, SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(slots, index, QUEUE_DISPLAY);
    }
    /*
     * NOTE: here fallback to N vop - do nothing
     */
    case MPEG4_INVALID_VOP :
    case MPEG4_N_VOP : {
    } break;
    case MPEG4_I_VOP :
    case MPEG4_P_VOP :
    case MPEG4_S_VOP :
        // the other case -> index reference 0
        index = hdr_ref0->slot_idx;
        if (!hdr_ref0->enqueued && index >= 0) {
            mpp_buf_slot_set_flag(slots, index, SLOT_QUEUE_USE);
            mpp_buf_slot_enqueue(slots, index, QUEUE_DISPLAY);
        }
        // non B frame send this frame to reference queue
        mpp_buf_slot_set_flag(slots, hdr_curr->slot_idx, SLOT_CODEC_USE);

        // release ref1
        index = hdr_ref1->slot_idx;
        if (index >= 0)
            mpp_buf_slot_clr_flag(slots, index, SLOT_CODEC_USE);

        // swap ref0 to ref1, current to ref0
        *hdr_ref1 = *hdr_ref0;
        *hdr_ref0 = *hdr_curr;
        hdr_curr->pts       = 0;
    }

    init_mpg4_hdr_vop(hdr_curr);
    hdr_curr->slot_idx = -1;
    p->last_pts = p->pts;

    mpg4d_dbg_func("out\n");

    return MPP_OK;
}